

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whitelist_impl.h
# Opt level: O3

int secp256k1_whitelist_compute_keys_and_message
              (secp256k1_context *ctx,uchar *msg32,secp256k1_gej *keys,
              secp256k1_pubkey *online_pubkeys,secp256k1_pubkey *offline_pubkeys,int n_keys,
              secp256k1_pubkey *sub_pubkey)

{
  secp256k1_context *ctx_00;
  secp256k1_gej *psVar1;
  int iVar2;
  ulong uVar3;
  uchar c [33];
  secp256k1_ge offline_ge;
  secp256k1_gej tweaked_gej;
  secp256k1_scalar tweak;
  secp256k1_ge online_ge;
  secp256k1_ge subkey_ge;
  size_t local_2d0;
  secp256k1_pubkey *local_2c8;
  uchar *local_2c0;
  secp256k1_context *local_2b8;
  ulong local_2b0;
  secp256k1_gej *local_2a8;
  secp256k1_pubkey *local_2a0;
  secp256k1_scalar local_298;
  uchar local_278 [40];
  secp256k1_ge local_250;
  secp256k1_sha256 local_1f8;
  secp256k1_gej local_188;
  secp256k1_scalar local_100;
  secp256k1_ge local_e0;
  secp256k1_ge local_88;
  
  local_2d0 = 0x21;
  local_1f8.s[0] = 0x6a09e667;
  local_1f8.s[1] = 0xbb67ae85;
  local_1f8.s[2] = 0x3c6ef372;
  local_1f8.s[3] = 0xa54ff53a;
  local_1f8.s[4] = 0x510e527f;
  local_1f8.s[5] = 0x9b05688c;
  local_1f8.s[6] = 0x1f83d9ab;
  local_1f8.s[7] = 0x5be0cd19;
  local_1f8.bytes = 0;
  local_2c8 = online_pubkeys;
  local_2b8 = ctx;
  secp256k1_pubkey_load(ctx,&local_88,sub_pubkey);
  iVar2 = secp256k1_eckey_pubkey_serialize(&local_88,local_278,&local_2d0,0x102);
  if (iVar2 == 0) {
LAB_00131a3e:
    iVar2 = 0;
  }
  else {
    local_2c0 = msg32;
    secp256k1_sha256_write(&local_1f8,local_278,local_2d0);
    if (0 < n_keys) {
      uVar3 = (ulong)(uint)n_keys;
      do {
        ctx_00 = local_2b8;
        local_2b0 = uVar3;
        local_2a8 = keys;
        local_2a0 = offline_pubkeys;
        secp256k1_pubkey_load(local_2b8,&local_250,offline_pubkeys);
        iVar2 = secp256k1_eckey_pubkey_serialize(&local_250,local_278,&local_2d0,0x102);
        if (iVar2 == 0) goto LAB_00131a3e;
        secp256k1_sha256_write(&local_1f8,local_278,local_2d0);
        secp256k1_pubkey_load(ctx_00,&local_e0,local_2c8);
        iVar2 = secp256k1_eckey_pubkey_serialize(&local_e0,local_278,&local_2d0,0x102);
        if (iVar2 == 0) goto LAB_00131a3e;
        secp256k1_sha256_write(&local_1f8,local_278,local_2d0);
        local_188.infinity = local_250.infinity;
        local_188.x.n[4] = local_250.x.n[4];
        local_188.x.n[2] = local_250.x.n[2];
        local_188.x.n[3] = local_250.x.n[3];
        local_188.x.n[0] = local_250.x.n[0];
        local_188.x.n[1] = local_250.x.n[1];
        local_188.y.n[4] = local_250.y.n[4];
        local_188.y.n[2] = local_250.y.n[2];
        local_188.y.n[3] = local_250.y.n[3];
        local_188.y.n[0] = local_250.y.n[0];
        local_188.y.n[1] = local_250.y.n[1];
        local_188.z.n[0] = 1;
        local_188.z.n[3] = 0;
        local_188.z.n[4] = 0;
        local_188.z.n[1] = 0;
        local_188.z.n[2] = 0;
        secp256k1_gej_add_ge_var(&local_188,&local_188,&local_88,(secp256k1_fe *)0x0);
        local_298.d[2] = 0;
        local_298.d[3] = 0;
        local_298.d[0] = 0;
        local_298.d[1] = 0;
        iVar2 = secp256k1_whitelist_hash_pubkey(&local_100,&local_188);
        uVar3 = local_2b0;
        if (iVar2 != 0) {
          secp256k1_ecmult(&local_188,&local_188,&local_100,&local_298);
        }
        psVar1 = local_2a8;
        secp256k1_gej_add_ge_var(local_2a8,&local_188,&local_e0,(secp256k1_fe *)0x0);
        keys = psVar1 + 1;
        local_2c8 = local_2c8 + 1;
        offline_pubkeys = local_2a0 + 1;
        uVar3 = uVar3 - 1;
      } while (uVar3 != 0);
    }
    secp256k1_sha256_finalize(&local_1f8,local_2c0);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int secp256k1_whitelist_compute_keys_and_message(const secp256k1_context* ctx, unsigned char *msg32, secp256k1_gej *keys, const secp256k1_pubkey *online_pubkeys, const secp256k1_pubkey *offline_pubkeys, const int n_keys, const secp256k1_pubkey *sub_pubkey) {
    unsigned char c[33];
    size_t size = 33;
    secp256k1_sha256 sha;
    int i;
    secp256k1_ge subkey_ge;

    secp256k1_sha256_initialize(&sha);
    secp256k1_pubkey_load(ctx, &subkey_ge, sub_pubkey);

    /* commit to sub-key */
    if (!secp256k1_eckey_pubkey_serialize(&subkey_ge, c, &size, SECP256K1_EC_COMPRESSED)) {
        return 0;
    }
    secp256k1_sha256_write(&sha, c, size);
    for (i = 0; i < n_keys; i++) {
        secp256k1_ge offline_ge;
        secp256k1_ge online_ge;
        secp256k1_gej tweaked_gej;

        /* commit to fixed keys */
        secp256k1_pubkey_load(ctx, &offline_ge, &offline_pubkeys[i]);
        if (!secp256k1_eckey_pubkey_serialize(&offline_ge, c, &size, SECP256K1_EC_COMPRESSED)) {
            return 0;
        }
        secp256k1_sha256_write(&sha, c, size);
        secp256k1_pubkey_load(ctx, &online_ge, &online_pubkeys[i]);
        if (!secp256k1_eckey_pubkey_serialize(&online_ge, c, &size, SECP256K1_EC_COMPRESSED)) {
            return 0;
        }
        secp256k1_sha256_write(&sha, c, size);

        /* compute tweaked keys */
        secp256k1_gej_set_ge(&tweaked_gej, &offline_ge);
        secp256k1_gej_add_ge_var(&tweaked_gej, &tweaked_gej, &subkey_ge, NULL);
        secp256k1_whitelist_tweak_pubkey(&tweaked_gej);
        secp256k1_gej_add_ge_var(&keys[i], &tweaked_gej, &online_ge, NULL);
    }
    secp256k1_sha256_finalize(&sha, msg32);
    return 1;
}